

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression_config.cpp
# Opt level: O0

optional_ptr<duckdb::CompressionFunction,_true> __thiscall
duckdb::DBConfig::GetCompressionFunction
          (DBConfig *this,CompressionType type,PhysicalType physical_type)

{
  bool bVar1;
  long in_RDI;
  CompressionFunctionSet *set;
  optional_ptr<duckdb::CompressionFunction,_true> function;
  lock_guard<std::mutex> l;
  PhysicalType in_stack_00000196;
  CompressionType in_stack_00000197;
  CompressionFunctionSet *in_stack_00000198;
  mutex_type *in_stack_ffffffffffffff88;
  lock_guard<std::mutex> *in_stack_ffffffffffffff90;
  undefined2 uVar2;
  optional_ptr<duckdb::CompressionFunction,_true> local_28 [4];
  CompressionFunction *local_8;
  
  set = (CompressionFunctionSet *)(in_RDI + 0x668);
  unique_ptr<duckdb::CompressionFunctionSet,_std::default_delete<duckdb::CompressionFunctionSet>,_true>
  ::operator->((unique_ptr<duckdb::CompressionFunctionSet,_std::default_delete<duckdb::CompressionFunctionSet>,_true>
                *)in_stack_ffffffffffffff90);
  uVar2 = (undefined2)((ulong)in_RDI >> 0x30);
  ::std::lock_guard<std::mutex>::lock_guard(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  unique_ptr<duckdb::CompressionFunctionSet,_std::default_delete<duckdb::CompressionFunctionSet>,_true>
  ::operator*((unique_ptr<duckdb::CompressionFunctionSet,_std::default_delete<duckdb::CompressionFunctionSet>,_true>
               *)in_stack_ffffffffffffff90);
  local_28[0] = FindCompressionFunction
                          (set,(CompressionType)((ushort)uVar2 >> 8),(PhysicalType)uVar2);
  bVar1 = optional_ptr<duckdb::CompressionFunction,_true>::operator_bool(local_28);
  if (bVar1) {
    local_8 = local_28[0].ptr;
  }
  else {
    unique_ptr<duckdb::CompressionFunctionSet,_std::default_delete<duckdb::CompressionFunctionSet>,_true>
    ::operator*((unique_ptr<duckdb::CompressionFunctionSet,_std::default_delete<duckdb::CompressionFunctionSet>,_true>
                 *)in_stack_ffffffffffffff90);
    local_8 = (CompressionFunction *)
              LoadCompressionFunction(in_stack_00000198,in_stack_00000197,in_stack_00000196);
  }
  ::std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x2a50fcb);
  return (optional_ptr<duckdb::CompressionFunction,_true>)local_8;
}

Assistant:

optional_ptr<CompressionFunction> DBConfig::GetCompressionFunction(CompressionType type,
                                                                   const PhysicalType physical_type) {
	lock_guard<mutex> l(compression_functions->lock);

	// Check if the function is already loaded into the global compression functions.
	auto function = FindCompressionFunction(*compression_functions, type, physical_type);
	if (function) {
		return function;
	}

	// We could not find the function in the global compression functions,
	// so we attempt loading it.
	return LoadCompressionFunction(*compression_functions, type, physical_type);
}